

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::CreateCDCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *tgtDir,string *relDir)

{
  string *__return_storage_ptr__;
  __type _Var1;
  bool bVar2;
  iterator __first;
  iterator __last;
  iterator __result;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string prefix;
  string outputForExisting;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  const_iterator local_98;
  string local_90;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string cmd;
  cmGlobalUnixMakefileGenerator3 *gg;
  char *cd_cmd;
  string *relDir_local;
  string *tgtDir_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  _Var1 = std::operator==(tgtDir,relDir);
  if (!_Var1) {
    bVar2 = cmLocalGenerator::IsMinGWMake((cmLocalGenerator *)this);
    __lhs = "cd ";
    if (bVar2) {
      __lhs = "cd /d ";
    }
    cmd.field_2._8_8_ = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    if (((((cmGlobalGenerator *)(cmd.field_2._8_8_ + 0x608))->MakeSilentFlag).field_2._M_local_buf
         [2] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,__lhs,&local_59);
      std::allocator<char>::~allocator(&local_59);
      cmOutputConverter::ConvertToOutputForExisting
                (&local_90,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,tgtDir,SHELL);
      std::__cxx11::string::operator+=((string *)local_58,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      local_a0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(commands);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_98,&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(commands,local_98,(value_type *)local_58);
      std::__cxx11::string::operator=((string *)local_58,__lhs);
      cmOutputConverter::ConvertToOutputForExisting
                ((string *)((long)&outputForExisting.field_2 + 8),
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,relDir,SHELL);
      std::__cxx11::string::operator+=
                ((string *)local_58,(string *)(outputForExisting.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(outputForExisting.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(commands,(value_type *)local_58);
      std::__cxx11::string::~string((string *)local_58);
    }
    else {
      __return_storage_ptr__ = (string *)((long)&prefix.field_2 + 8);
      cmOutputConverter::ConvertToOutputForExisting
                (__return_storage_ptr__,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,tgtDir,SHELL);
      std::operator+(&local_128,__lhs,__return_storage_ptr__);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_128," && ");
      std::__cxx11::string::~string((string *)&local_128);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(commands);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(commands);
      __result = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(commands);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmLocalUnixMakefileGenerator3::CreateCDCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__result._M_current,(string *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
    }
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CreateCDCommand(
  std::vector<std::string>& commands, std::string const& tgtDir,
  std::string const& relDir)
{
  // do we need to cd?
  if (tgtDir == relDir) {
    return;
  }

  // In a Windows shell we must change drive letter too.  The shell
  // used by NMake and Borland make does not support "cd /d" so this
  // feature simply cannot work with them (Borland make does not even
  // support changing the drive letter with just "d:").
  const char* cd_cmd = this->IsMinGWMake() ? "cd /d " : "cd ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (!gg->UnixCD) {
    // On Windows we must perform each step separately and then change
    // back because the shell keeps the working directory between
    // commands.
    std::string cmd = cd_cmd;
    cmd += this->ConvertToOutputForExisting(tgtDir);
    commands.insert(commands.begin(), cmd);

    // Change back to the starting directory.
    cmd = cd_cmd;
    cmd += this->ConvertToOutputForExisting(relDir);
    commands.push_back(std::move(cmd));
  } else {
    // On UNIX we must construct a single shell command to change
    // directory and build because make resets the directory between
    // each command.
    std::string outputForExisting = this->ConvertToOutputForExisting(tgtDir);
    std::string prefix = cd_cmd + outputForExisting + " && ";
    std::transform(commands.begin(), commands.end(), commands.begin(),
                   [&prefix](std::string const& s) { return prefix + s; });
  }
}